

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::anon_unknown_0::BasicGraphicsTestInstance::BasicGraphicsTestInstance
          (BasicGraphicsTestInstance *this,Context *context,StageFlagVector *stages,
          bool inRenderPass)

{
  SimpleGraphicsPipelineBuilder *this_00;
  char *entry_name;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_88;
  deUint64 local_68;
  DeviceInterface *pDStack_60;
  VkDevice local_58;
  VkAllocationCallbacks *pVStack_50;
  Vector<unsigned_int,_2> local_40;
  Vector<unsigned_int,_2> local_38;
  
  TimestampTestInstance::TimestampTestInstance
            (&this->super_TimestampTestInstance,context,stages,inRenderPass);
  (this->super_TimestampTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__BasicGraphicsTestInstance_00bcc6e0;
  *(undefined8 *)(this->m_renderSize).m_data = 0x2000000020;
  this->m_colorFormat = VK_FORMAT_R8G8B8A8_UNORM;
  this->m_depthFormat = VK_FORMAT_D16_UNORM;
  (this->m_vertexBufferAlloc).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data.ptr = (Allocation *)0x0;
  this_00 = &this->m_pipelineBuilder;
  (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_colorImageAlloc).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data.ptr = (Allocation *)0x0;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_depthImageAlloc).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data.ptr = (Allocation *)0x0;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
  m_internal = 0;
  (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
  m_internal = 0;
  (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal = 0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal = 0;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_vertices).
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vertices).
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (this->m_vertices).
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_pipelineBuilder).m_context = context;
  (this->m_pipelineBuilder).m_patchControlPoints = 0;
  memset((this->m_pipelineBuilder).m_shaderModules,0,0xc4);
  (this->m_pipelineBuilder).m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
  object.m_internal = 0;
  (this->m_pipelineBuilder).m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
  deleter.m_deviceIface = (DeviceInterface *)0x0;
  (this->m_pipelineBuilder).m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
  deleter.m_device = (VkDevice)0x0;
  (this->m_pipelineBuilder).m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
  deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_pipelineBuilder).m_graphicsPipelines.super_RefBase<vk::Handle<(vk::HandleType)18>_>.
  m_data.object.m_internal = 0;
  (this->m_pipelineBuilder).m_graphicsPipelines.super_RefBase<vk::Handle<(vk::HandleType)18>_>.
  m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  (this->m_pipelineBuilder).m_graphicsPipelines.super_RefBase<vk::Handle<(vk::HandleType)18>_>.
  m_data.deleter.m_device = (VkDevice)0x0;
  (this->m_pipelineBuilder).m_graphicsPipelines.super_RefBase<vk::Handle<(vk::HandleType)18>_>.
  m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_graphicsPipelines).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
  m_internal = 0;
  (this->m_graphicsPipelines).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  (this->m_graphicsPipelines).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device
       = (VkDevice)0x0;
  (this->m_graphicsPipelines).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  buildVertexBuffer(this);
  (*(this->super_TimestampTestInstance).super_TestInstance._vptr_TestInstance[6])
            (this,(ulong)this->m_colorFormat,(ulong)this->m_depthFormat);
  tcu::Vector<unsigned_int,_2>::Vector(&local_38,&this->m_renderSize);
  entry_name = (char *)(ulong)this->m_depthFormat;
  (*(this->super_TimestampTestInstance).super_TestInstance._vptr_TestInstance[7])
            (this,&local_38,(ulong)this->m_colorFormat);
  SimpleGraphicsPipelineBuilder::bindShaderStage
            (this_00,VK_SHADER_STAGE_VERTEX_BIT,"color_vert",entry_name);
  SimpleGraphicsPipelineBuilder::bindShaderStage
            (this_00,VK_SHADER_STAGE_FRAGMENT_BIT,"color_frag",entry_name);
  tcu::Vector<unsigned_int,_2>::Vector(&local_40,&this->m_renderSize);
  SimpleGraphicsPipelineBuilder::buildPipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_88,this_00,&local_40,
             (VkRenderPass)
             (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
             m_internal);
  local_58 = local_88.m_data.deleter.m_device;
  pVStack_50 = local_88.m_data.deleter.m_allocator;
  local_68 = local_88.m_data.object.m_internal;
  pDStack_60 = local_88.m_data.deleter.m_deviceIface;
  local_88.m_data.object.m_internal = 0;
  local_88.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_88.m_data.deleter.m_device = (VkDevice)0x0;
  local_88.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::reset
            (&(this->m_graphicsPipelines).super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (this->m_graphicsPipelines).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device
       = local_58;
  (this->m_graphicsPipelines).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
  m_allocator = pVStack_50;
  (this->m_graphicsPipelines).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
  m_internal = local_68;
  (this->m_graphicsPipelines).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
  m_deviceIface = pDStack_60;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_88);
  return;
}

Assistant:

BasicGraphicsTestInstance::BasicGraphicsTestInstance(Context&              context,
													 const StageFlagVector stages,
													 const bool            inRenderPass)
													 : TimestampTestInstance (context,stages,inRenderPass)
													 , m_renderSize  (32, 32)
													 , m_colorFormat (VK_FORMAT_R8G8B8A8_UNORM)
													 , m_depthFormat (VK_FORMAT_D16_UNORM)
													 , m_pipelineBuilder (context)
{
	buildVertexBuffer();

	buildRenderPass(m_colorFormat, m_depthFormat);

	buildFrameBuffer(m_renderSize, m_colorFormat, m_depthFormat);

	m_pipelineBuilder.bindShaderStage(VK_SHADER_STAGE_VERTEX_BIT, "color_vert", "main");
	m_pipelineBuilder.bindShaderStage(VK_SHADER_STAGE_FRAGMENT_BIT, "color_frag", "main");

	m_graphicsPipelines = m_pipelineBuilder.buildPipeline(m_renderSize, *m_renderPass);

}